

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_TestFailure_LongLongsEqualFailure_TestShell::createTest
          (TEST_TestFailure_LongLongsEqualFailure_TestShell *this)

{
  TEST_TestFailure_LongLongsEqualFailure_Test *this_00;
  
  this_00 = (TEST_TestFailure_LongLongsEqualFailure_Test *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
                         ,0x8e);
  TEST_TestFailure_LongLongsEqualFailure_Test::TEST_TestFailure_LongLongsEqualFailure_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestFailure, LongLongsEqualFailure)
{
#if CPPUTEST_USE_LONG_LONG
    LongLongsEqualFailure f(test, failFileName, failLineNumber, 1, 2, "");
    FAILURE_EQUAL("expected <1 (0x1)>\n\tbut was  <2 (0x2)>", f);
#else
    cpputest_longlong dummy_longlong;
    LongLongsEqualFailure f(test, failFileName, failLineNumber, dummy_longlong, dummy_longlong, "");
    FAILURE_EQUAL("expected <<longlong_unsupported> >\n\tbut was  <<longlong_unsupported> >", f);
#endif
}